

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

uint __thiscall IR::Instr::GetArgOutCount(Instr *this,bool getInterpreterArgOutCount)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  uint32 uVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *this_00;
  IntConstOpnd *this_01;
  
  OVar1 = this->m_opcode;
  if ((((6 < OVar1 - 0x248) || ((0x65U >> (OVar1 - 0x248 & 0x1f) & 1) == 0)) && (OVar1 != StartCall)
      ) && (OVar1 != LoweredStartCall)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe37,
                       "(opcode == Js::OpCode::StartCall || opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd|| opcode == Js::OpCode::InlineNonTrackingBuiltInEnd || opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall)"
                       ,
                       "opcode == Js::OpCode::StartCall || opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd|| opcode == Js::OpCode::InlineNonTrackingBuiltInEnd || opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall"
                      );
    if (!bVar3) goto LAB_004c29f2;
    *puVar6 = 0;
  }
  if (OVar1 != StartCall && getInterpreterArgOutCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe39,"(!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall)",
                       "!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall");
    if (!bVar3) goto LAB_004c29f2;
    *puVar6 = 0;
  }
  if (this->m_src2 == (Opnd *)0x0 || !getInterpreterArgOutCount) {
LAB_004c2911:
    this_01 = (IntConstOpnd *)this->m_src1;
  }
  else {
    this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    bVar3 = JITTimeFunctionBody::IsAsmJsMode(this_00);
    if (bVar3) goto LAB_004c2911;
    this_01 = (IntConstOpnd *)this->m_src2;
  }
  OVar4 = Opnd::GetKind(&this_01->super_Opnd);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) {
LAB_004c29f2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  uVar5 = IntConstOpnd::AsUint32(this_01);
  return uVar5;
}

Assistant:

uint Instr::GetArgOutCount(bool getInterpreterArgOutCount)
{
    // There are cases of inlining like .apply and .call target inlining, where we muck around with the ArgOut sequence,
    // and make it different from the one the interpreter sees (and expects, on a bailout).
    // In such cases, we set the interpreter version of the number of ArgOuts as the src2 of StartCall,
    // and any code that queries the argout count for bailout purposes should look at the src2 (if available) of these instructions.

    // If the src2 is not set, that means that the interpreter and the JIT versions of the argout count are the same.

    Js::OpCode opcode = this->m_opcode;
    Assert(opcode == Js::OpCode::StartCall ||
           opcode == Js::OpCode::InlineeEnd || opcode == Js::OpCode::InlineBuiltInEnd|| opcode == Js::OpCode::InlineNonTrackingBuiltInEnd ||
           opcode == Js::OpCode::EndCallForPolymorphicInlinee || opcode == Js::OpCode::LoweredStartCall);

    Assert(!getInterpreterArgOutCount || opcode == Js::OpCode::StartCall);
    uint argOutCount = !this->GetSrc2() || !getInterpreterArgOutCount || m_func->GetJITFunctionBody()->IsAsmJsMode()
        ? this->GetSrc1()->AsIntConstOpnd()->AsUint32()
        : this->GetSrc2()->AsIntConstOpnd()->AsUint32();

    return (uint)argOutCount;
}